

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  int *piVar5;
  void *pvVar6;
  float *pfVar7;
  float *pfVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  void *pvVar15;
  int iVar16;
  int i;
  void *pvVar17;
  ulong uVar18;
  int iVar19;
  void *pvVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float *outptr;
  Option opt_g;
  ulong local_118;
  Mat local_f8;
  void *local_a8;
  long local_a0;
  InnerProduct *local_98;
  void *local_90;
  ulong local_88;
  long local_80;
  Option local_78;
  
  iVar19 = this->weight_data_size;
  iVar1 = this->num_output;
  uVar2 = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  local_f8.data = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  local_f8.refcount._0_4_ = SUB84(piVar5,0);
  local_f8.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  local_f8.elemsize._0_4_ = (undefined4)sVar4;
  local_f8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
  local_f8.elempack = bottom_blob->elempack;
  local_f8.allocator = bottom_blob->allocator;
  local_f8.dims = bottom_blob->dims;
  local_f8.w = bottom_blob->w;
  local_f8.h = bottom_blob->h;
  local_f8.d = bottom_blob->d;
  uVar3 = bottom_blob->w;
  uVar14 = bottom_blob->h;
  local_f8.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  local_f8.c = uVar2;
  if (sVar4 != 1) {
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    uVar18._0_1_ = opt->use_bf16_storage;
    uVar18._1_1_ = opt->use_fp16_packed;
    uVar18._2_1_ = opt->use_fp16_storage;
    uVar18._3_1_ = opt->use_fp16_arithmetic;
    uVar18._4_1_ = opt->use_int8_packed;
    uVar18._5_1_ = opt->use_int8_storage;
    uVar18._6_1_ = opt->use_int8_arithmetic;
    uVar18._7_1_ = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_reserved_1 = opt->use_reserved_1;
    local_78.use_reserved_2 = opt->use_reserved_2;
    local_78.use_reserved_3 = opt->use_reserved_3;
    local_78.use_reserved_4 = opt->use_reserved_4;
    local_78.use_reserved_5 = opt->use_reserved_5;
    local_78.use_reserved_6 = opt->use_reserved_6;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78.blob_allocator = opt->workspace_allocator;
    local_78._32_8_ = uVar18 & 0xffffffffffffff;
    quantize_to_int8(bottom_blob,&local_f8,&this->bottom_blob_int8_scales,&local_78);
  }
  if ((bottom_blob->dims == 2) && (1 < (int)uVar14 && uVar3 == iVar19 / iVar1)) {
    Mat::create(top_blob,this->num_output,uVar14,4,opt->blob_allocator);
    local_90 = top_blob->data;
    iVar19 = -100;
    if ((local_90 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) goto LAB_001d5aa6;
    local_a0 = (long)top_blob->w * top_blob->elemsize;
    uVar2 = this->num_output;
    iVar19 = this->bias_term;
    local_a8 = (this->weight_data).data;
    pvVar6 = (this->weight_data_int8_scales).data;
    iVar1 = this->activation_type;
    local_88 = (ulong)uVar14;
    local_80 = (long)local_f8.w * CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize);
    local_118 = 0;
    pvVar20 = local_f8.data;
    local_98 = this;
    do {
      pvVar10 = local_90;
      if (0 < (int)uVar2) {
        lVar13 = local_a0 * local_118;
        pfVar7 = (float *)(local_98->bottom_blob_int8_scales).data;
        pfVar8 = (float *)(local_98->activation_params).data;
        pvVar9 = (local_98->bias_data).data;
        uVar18 = 0;
        pvVar17 = local_a8;
        do {
          fVar23 = 0.0;
          fVar21 = 0.0;
          if (0 < (int)uVar3) {
            uVar11 = 0;
            iVar12 = 0;
            do {
              iVar12 = iVar12 + (int)*(char *)((long)pvVar17 + uVar11) *
                                (int)*(char *)((long)pvVar20 + uVar11);
              uVar11 = uVar11 + 1;
            } while (uVar3 != uVar11);
            fVar21 = (float)iVar12;
          }
          fVar24 = *(float *)((long)pvVar6 + uVar18 * 4);
          if (fVar24 != 0.0) {
            fVar23 = 1.0 / (fVar24 * *pfVar7);
          }
          fVar23 = fVar23 * fVar21;
          if (iVar19 != 0) {
            fVar23 = fVar23 + *(float *)((long)pvVar9 + uVar18 * 4);
          }
          fVar21 = fVar23;
          switch(iVar1) {
          case 1:
            if (fVar23 <= 0.0) {
              fVar21 = 0.0;
            }
            break;
          case 2:
            fVar21 = (float)(~-(uint)(0.0 < fVar23) & (uint)*pfVar8 |
                            -(uint)(0.0 < fVar23) & 0x3f800000) * fVar23;
            break;
          case 3:
            if (fVar23 <= *pfVar8) {
              fVar23 = *pfVar8;
            }
            fVar21 = fVar23;
            if (pfVar8[1] <= fVar23) {
              fVar21 = pfVar8[1];
            }
            break;
          case 4:
            fVar21 = expf(-fVar23);
            fVar21 = 1.0 / (fVar21 + 1.0);
            break;
          case 5:
            fVar21 = expf(fVar23);
            fVar21 = logf(fVar21 + 1.0);
            fVar21 = tanhf(fVar21);
            fVar21 = fVar21 * fVar23;
            break;
          case 6:
            fVar24 = *pfVar8;
            fVar22 = -pfVar8[1] / fVar24;
            fVar21 = 0.0;
            if ((fVar22 <= fVar23) && (fVar21 = fVar23, fVar23 <= fVar22 + 1.0 / fVar24)) {
              fVar21 = (fVar24 * fVar23 + pfVar8[1]) * fVar23;
            }
          }
          *(float *)((long)pvVar10 + uVar18 * 4 + lVar13) = fVar21;
          uVar18 = uVar18 + 1;
          pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar3);
        } while (uVar18 != uVar2);
      }
      local_118 = local_118 + 1;
      pvVar20 = (void *)((long)pvVar20 + local_80);
    } while (local_118 != local_88);
  }
  else {
    Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
    iVar19 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_001d5aa6;
    iVar19 = this->num_output;
    if (0 < (long)iVar19) {
      uVar14 = uVar14 * uVar3;
      pvVar6 = top_blob->data;
      pvVar20 = (this->weight_data).data;
      pvVar10 = (this->weight_data_int8_scales).data;
      pfVar7 = (float *)(this->bottom_blob_int8_scales).data;
      iVar1 = this->bias_term;
      iVar12 = this->activation_type;
      pvVar9 = (this->bias_data).data;
      pfVar8 = (float *)(this->activation_params).data;
      lVar13 = 0;
      do {
        fVar21 = 0.0;
        if (0 < (int)uVar2) {
          uVar18 = 0;
          iVar16 = 0;
          pvVar17 = local_f8.data;
          pvVar15 = pvVar20;
          do {
            if (0 < (int)uVar14) {
              uVar11 = 0;
              do {
                iVar16 = iVar16 + (int)*(char *)((long)pvVar15 + uVar11) *
                                  (int)*(char *)((long)pvVar17 + uVar11);
                uVar11 = uVar11 + 1;
              } while (uVar14 != uVar11);
            }
            uVar18 = uVar18 + 1;
            pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar14);
            pvVar17 = (void *)((long)pvVar17 +
                              local_f8.cstep *
                              CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
          } while (uVar18 != uVar2);
          fVar21 = (float)iVar16;
        }
        fVar23 = *(float *)((long)pvVar10 + lVar13 * 4);
        fVar24 = 0.0;
        if (fVar23 != 0.0) {
          fVar24 = 1.0 / (fVar23 * *pfVar7);
        }
        fVar24 = fVar24 * fVar21;
        if (iVar1 != 0) {
          fVar24 = fVar24 + *(float *)((long)pvVar9 + lVar13 * 4);
        }
        fVar21 = fVar24;
        switch(iVar12) {
        case 1:
          if (fVar24 <= 0.0) {
            fVar21 = 0.0;
          }
          break;
        case 2:
          fVar21 = (float)(~-(uint)(0.0 < fVar24) & (uint)*pfVar8 |
                          -(uint)(0.0 < fVar24) & 0x3f800000) * fVar24;
          break;
        case 3:
          if (fVar24 <= *pfVar8) {
            fVar24 = *pfVar8;
          }
          fVar21 = fVar24;
          if (pfVar8[1] <= fVar24) {
            fVar21 = pfVar8[1];
          }
          break;
        case 4:
          fVar21 = expf(-fVar24);
          fVar21 = 1.0 / (fVar21 + 1.0);
          break;
        case 5:
          fVar21 = expf(fVar24);
          fVar21 = logf(fVar21 + 1.0);
          fVar21 = tanhf(fVar21);
          fVar21 = fVar21 * fVar24;
          break;
        case 6:
          fVar23 = *pfVar8;
          fVar22 = -pfVar8[1] / fVar23;
          fVar21 = 0.0;
          if ((fVar22 <= fVar24) && (fVar21 = fVar24, fVar24 <= fVar22 + 1.0 / fVar23)) {
            fVar21 = (fVar23 * fVar24 + pfVar8[1]) * fVar24;
          }
        }
        *(float *)((long)pvVar6 + lVar13 * 4) = fVar21;
        lVar13 = lVar13 + 1;
        pvVar20 = (void *)((long)pvVar20 + (long)(int)(uVar14 * uVar2));
      } while (lVar13 != iVar19);
    }
  }
  iVar19 = 0;
LAB_001d5aa6:
  piVar5 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}